

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

void fsnav_linal_kalman_predict_U_diag(double *x,double *S,double *U,double *q2,size_t n,size_t m)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  double *pdVar11;
  long lVar12;
  double dVar13;
  
  fsnav_linal_u_mul(x,U,x,n,1);
  if (n != 0) {
    lVar2 = n * 2;
    lVar1 = n * 2 + 1;
    lVar12 = n - 2;
    lVar4 = 0;
    uVar9 = 0;
    lVar10 = 0;
    do {
      uVar8 = uVar9;
      do {
        S[lVar10] = U[(lVar1 - uVar9) * uVar9 >> 1] * S[lVar10];
        if (~uVar9 + n != 0) {
          uVar3 = (lVar1 - uVar8) * uVar8 >> 1;
          uVar6 = lVar10 + ~uVar9 + n;
          if (uVar6 <= uVar3) {
            dVar13 = S[lVar10];
            lVar7 = lVar12;
            pdVar11 = (double *)((long)U + lVar4 * 4 + 8);
            do {
              dVar13 = S[uVar6] * *pdVar11 + dVar13;
              S[lVar10] = dVar13;
              if (lVar7 == 0) break;
              uVar6 = uVar6 + lVar7;
              pdVar11 = pdVar11 + 1;
              lVar7 = lVar7 + -1;
            } while (uVar6 <= uVar3);
          }
        }
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 1;
      } while (uVar8 < n);
      uVar9 = uVar9 + 1;
      lVar12 = lVar12 + -1;
      lVar4 = lVar4 + lVar2;
      lVar2 = lVar2 + -2;
    } while (uVar9 != n);
  }
  fsnav_linal_uuT(S,S,n);
  if (m != 0) {
    lVar12 = n * 2 + 1;
    sVar5 = 0;
    do {
      uVar9 = lVar12 * sVar5 & 0xfffffffffffffffe;
      *(double *)((long)S + uVar9 * 4) = q2[sVar5] + *(double *)((long)S + uVar9 * 4);
      sVar5 = sVar5 + 1;
      lVar12 = lVar12 + -1;
    } while (m != sVar5);
  }
  fsnav_linal_chol(S,S,n);
  return;
}

Assistant:

void fsnav_linal_kalman_predict_U_diag(double* x, double* S, double* U, double* q2, const size_t n, const size_t m)
{
	size_t i, j, j1, k0, k1, k2, k, k10, j10;

	fsnav_linal_u_mul(x, U, x, n, 1);    // x = F*x  	
	for (i = 0, k0 = 0; i < n; i++) {
		k10 = i*(2*n-i+1)/2;            // start from the diagonal in U
		j10 = n-i-1;
		for (j = i; j < n; j++, k0++) {
			k1 = k10;
			S[k0] *= U[k1];             // S = F*S
			k2 = j*(2*n-j+1)/2;         // finish at the diagonal in S
			for (j1 = j10, k1++, k = k0+j1; j1 > 0 && k <= k2; j1--, k1++, k += j1)
				S[k0] += S[k]*U[k1];
		}
	}
	fsnav_linal_uuT(S, S, n);            // P = S*S^T
	for (i = 0; i < m; i++)
		S[i*(2*n-i+1)/2] += q2[i];      // P = P + Q, Q = [diag(q2) 0; 0 0]
	fsnav_linal_chol(S, S, n);           // P = S*S^T
}